

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O0

bool __thiscall
dg::vr::VectorSet<llvm::Value_const*>::erase<llvm::Value_const*,bool>
          (VectorSet<const_llvm::Value_*> *this,Value **val)

{
  iterator __position;
  __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  *in_RDI;
  iterator it;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *in_stack_ffffffffffffffb8;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *in_stack_ffffffffffffffd0;
  VectorSet<const_llvm::Value_*> *in_stack_ffffffffffffffd8;
  bool local_1;
  
  find<llvm::Value_const*>(in_stack_ffffffffffffffd8,(Value **)in_stack_ffffffffffffffd0);
  __position = std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::end
                         (in_stack_ffffffffffffffb8);
  local_1 = __gnu_cxx::operator==
                      (in_RDI,(__normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                               *)in_stack_ffffffffffffffb8);
  if (!local_1) {
    __gnu_cxx::
    __normal_iterator<llvm::Value_const*const*,std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>>
    ::__normal_iterator<llvm::Value_const**>
              ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                *)in_RDI,
               (__normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                *)in_stack_ffffffffffffffb8);
    std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::erase
              (in_stack_ffffffffffffffd0,(const_iterator)__position._M_current);
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool erase(const S &val) {
        auto it = find(val);
        if (it == vec.end())
            return false;
        vec.erase(it);
        return true;
    }